

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int tableAndColumnIndex(SrcList *pSrc,int iStart,int iEnd,char *zCol,int *piTab,int *piCol,
                       int bIgnoreHidden)

{
  undefined1 *puVar1;
  Table *pTab;
  uint uVar2;
  Table **ppTVar3;
  
  if (iStart <= iEnd) {
    ppTVar3 = &pSrc->a[iStart].pSTab;
    do {
      pTab = *ppTVar3;
      uVar2 = sqlite3ColumnIndex(pTab,zCol);
      if ((-1 < (int)uVar2) && ((bIgnoreHidden == 0 || ((pTab->aCol[uVar2].colFlags & 2) == 0)))) {
        if (piTab != (int *)0x0) {
          if ((*(byte *)((long)ppTVar3 + 10) & 0x40) != 0) {
            puVar1 = &((anon_union_8_3_5f9225e5_for_u4 *)(ppTVar3 + 6))->pSubq->pSelect->pEList->a
                      [uVar2].fg.field_0x1;
            *(ushort *)puVar1 = *(ushort *)puVar1 | 0x40;
          }
          *piTab = iStart;
          *piCol = uVar2;
          return 1;
        }
        return 1;
      }
      iStart = iStart + 1;
      ppTVar3 = ppTVar3 + 9;
    } while (iEnd + 1 != iStart);
  }
  return 0;
}

Assistant:

static int tableAndColumnIndex(
  SrcList *pSrc,       /* Array of tables to search */
  int iStart,          /* First member of pSrc->a[] to check */
  int iEnd,            /* Last member of pSrc->a[] to check */
  const char *zCol,    /* Name of the column we are looking for */
  int *piTab,          /* Write index of pSrc->a[] here */
  int *piCol,          /* Write index of pSrc->a[*piTab].pTab->aCol[] here */
  int bIgnoreHidden    /* Ignore hidden columns */
){
  int i;               /* For looping over tables in pSrc */
  int iCol;            /* Index of column matching zCol */

  assert( iEnd<pSrc->nSrc );
  assert( iStart>=0 );
  assert( (piTab==0)==(piCol==0) );  /* Both or neither are NULL */

  for(i=iStart; i<=iEnd; i++){
    iCol = sqlite3ColumnIndex(pSrc->a[i].pSTab, zCol);
    if( iCol>=0
     && (bIgnoreHidden==0 || IsHiddenColumn(&pSrc->a[i].pSTab->aCol[iCol])==0)
    ){
      if( piTab ){
        sqlite3SrcItemColumnUsed(&pSrc->a[i], iCol);
        *piTab = i;
        *piCol = iCol;
      }
      return 1;
    }
  }
  return 0;
}